

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::norm16HasDecompBoundaryBefore(Normalizer2Impl *this,uint16_t norm16)

{
  uint16_t *puVar1;
  bool local_3a;
  bool local_39;
  uint16_t firstUnit;
  uint16_t *mapping;
  uint16_t norm16_local;
  Normalizer2Impl *this_local;
  
  if (norm16 < this->minNoNoCompNoMaybeCC) {
    this_local._7_1_ = true;
  }
  else if (norm16 < this->limitNoNo) {
    puVar1 = getMapping(this,norm16);
    local_3a = true;
    if ((*puVar1 & 0x80) != 0) {
      local_3a = (puVar1[-1] & 0xff00) == 0;
    }
    this_local._7_1_ = local_3a;
  }
  else {
    local_39 = norm16 < 0xfc01 || norm16 == 0xfe00;
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

UBool Normalizer2Impl::norm16HasDecompBoundaryBefore(uint16_t norm16) const {
    if (norm16 < minNoNoCompNoMaybeCC) {
        return TRUE;
    }
    if (norm16 >= limitNoNo) {
        return norm16 <= MIN_NORMAL_MAYBE_YES || norm16 == JAMO_VT;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    // TRUE if leadCC==0 (hasFCDBoundaryBefore())
    return (firstUnit&MAPPING_HAS_CCC_LCCC_WORD)==0 || (*(mapping-1)&0xff00)==0;
}